

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<kj::Array<char>_>::dispose(ArrayBuilder<kj::Array<char>_> *this)

{
  Array<char> *firstElement;
  RemoveConst<kj::Array<char>_> *pRVar1;
  Array<char> *pAVar2;
  Array<char> *endCopy;
  Array<char> *posCopy;
  Array<char> *ptrCopy;
  ArrayBuilder<kj::Array<char>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pAVar2 = this->endPtr;
  if (firstElement != (Array<char> *)0x0) {
    this->ptr = (Array<char> *)0x0;
    this->pos = (RemoveConst<kj::Array<char>_> *)0x0;
    this->endPtr = (Array<char> *)0x0;
    ArrayDisposer::dispose<kj::Array<char>>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x18,
               ((long)pAVar2 - (long)firstElement) / 0x18);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }